

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_conn.c
# Opt level: O0

void forwarder_control(worker_handle *wh)

{
  proxy_conn_handle *pc_00;
  undefined8 *puVar1;
  proxy_handle *ppVar2;
  char *pcVar3;
  uint local_1034;
  int ret;
  proxy_msg *msg;
  uint8_t buf [4096];
  uint32_t addr;
  proxy_conn_priv *priv;
  proxy_conn_handle *pc;
  worker_handle *wh_local;
  
  pc_00 = (proxy_conn_handle *)wh->func_ctx;
  puVar1 = (undefined8 *)pc_00->priv;
  memset(&msg,0,0x1000);
  msg._0_1_ = 6;
  proxy_log(pc_00->ph,LOG_LEVEL_DEBUG,
            "UDP Control forwarding thread is starting for client \'%s\'\n",puVar1 + 0x21b);
  do {
    local_1034 = conn_recv_any((conn_handle *)(puVar1 + 1),buf + 1,0xff7,(uint32_t *)(buf + 0xffc),
                               (uint16_t *)0x0);
    if ((int)local_1034 < 1) {
      if (local_1034 == 0) {
        local_1034 = 0xffffffe0;
      }
    }
    else {
      msg._1_1_ = buf[0xffc];
      msg._2_1_ = buf[0xffd];
      msg._3_1_ = buf[0xffe];
      msg._4_1_ = buf[0xfff];
      unique0x10000267 = local_1034;
      proxy_log(pc_00->ph,LOG_LEVEL_DEBUG,"Sending UDP_DATA message to client \'%s\' (%d bytes)\n",
                puVar1 + 0x21b,(ulong)local_1034);
      mutex_lock((mutex_handle *)(puVar1 + 0xe));
      local_1034 = conn_send((conn_handle *)*puVar1,(uint8_t *)&msg,
                             (ulong)stack0xffffffffffffefdd + 9);
      mutex_unlock((mutex_handle *)(puVar1 + 0xe));
      if ((int)local_1034 < 0) {
        conn_close((conn_handle *)(puVar1 + 1));
        ppVar2 = pc_00->ph;
        pcVar3 = strerror(-local_1034);
        proxy_log(ppVar2,LOG_LEVEL_DEBUG,
                  "Client \'%s\' UDP Control thread is returning due to a client connection error (%d): %s\n"
                  ,puVar1 + 0x21b,(ulong)-local_1034,pcVar3);
        if (local_1034 == 0xffffff95) {
          return;
        }
        if (local_1034 == 0xffffff98) {
          return;
        }
        if (local_1034 == 0xffffffe0) {
          return;
        }
        if (local_1034 == 0xfffffffc) {
          return;
        }
        proxy_conn_drop(pc_00);
        return;
      }
    }
    if ((int)local_1034 < 0) {
      if ((((local_1034 != 0xffffff95) && (local_1034 != 0xffffff98)) && (local_1034 != 0xffffffe0))
         && (local_1034 != 0xfffffffc)) {
        ppVar2 = pc_00->ph;
        pcVar3 = strerror(-local_1034);
        proxy_log(ppVar2,LOG_LEVEL_INFO,
                  "Failed to receive data on client \'%s\' UDP Control connection (%d): %s\n",
                  puVar1 + 0x21b,(ulong)-local_1034,pcVar3);
        proxy_conn_drop(pc_00);
      }
      conn_close((conn_handle *)(puVar1 + 1));
      proxy_log(pc_00->ph,LOG_LEVEL_DEBUG,"Client \'%s\' UDP Control worker is returning cleanly\n",
                puVar1 + 0x21b);
      return;
    }
  } while( true );
}

Assistant:

static void forwarder_control(struct worker_handle *wh)
{
	struct proxy_conn_handle *pc = wh->func_ctx;
	struct proxy_conn_priv *priv = pc->priv;

	uint32_t addr;
	uint8_t buf[CONN_BUFF_LEN] = { 0 };
	struct proxy_msg *msg = (struct proxy_msg *)buf;
	int ret;

	msg->type = PROXY_MSG_TYPE_UDP_CONTROL;

	proxy_log(pc->ph, LOG_LEVEL_DEBUG,
		  "UDP Control forwarding thread is starting for client '%s'\n",
		  priv->callsign);

	do {
		ret = conn_recv_any(&priv->conn_control, buf + sizeof(*msg),
				    CONN_BUFF_LEN_HEADERLESS, &addr, NULL);
		if (ret > 0) {
			msg->address = addr;
			msg->size = ret;

			proxy_log(pc->ph, LOG_LEVEL_DEBUG,
				  "Sending UDP_DATA message to client '%s' (%d bytes)\n",
				  priv->callsign, msg->size);

			mutex_lock(&priv->mutex_client_send);

			ret = conn_send(priv->conn_client, (uint8_t *)msg,
					sizeof(*msg) + msg->size);

			mutex_unlock(&priv->mutex_client_send);

			/* This is an error with the client connection */
			if (ret < 0) {
				conn_close(&priv->conn_control);

				proxy_log(pc->ph, LOG_LEVEL_DEBUG,
					  "Client '%s' UDP Control thread is returning due to a client connection error (%d): %s\n",
					  priv->callsign, -ret, strerror(-ret));

				switch (ret) {
				case -ECONNRESET:
				case -EINTR:
				case -ENOTCONN:
				case -EPIPE:
					break;
				default:
					proxy_conn_drop(pc);
					break;
				}

				return;
			}
		} else if (ret == 0) {
			ret = -EPIPE;
		}
	} while (ret >= 0);

	switch (ret) {
	case -ECONNRESET:
	case -EINTR:
	case -ENOTCONN:
	case -EPIPE:
		break;
	default:
		proxy_log(pc->ph, LOG_LEVEL_INFO,
			  "Failed to receive data on client '%s' UDP Control connection (%d): %s\n",
			  priv->callsign, -ret, strerror(-ret));
		/* Since the UDP ports must be open while the client is connected,
		 * we should shut down the client if we don't exit cleanly
		 */
		proxy_conn_drop(pc);
		break;
	}

	conn_close(&priv->conn_control);

	proxy_log(pc->ph, LOG_LEVEL_DEBUG,
		  "Client '%s' UDP Control worker is returning cleanly\n",
		  priv->callsign);
}